

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *this;
  XSerializeEngine *valueToAdopt;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  XMLSize_t itemIndex;
  ulong uVar2;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  valueToAdopt = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    if (this == (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x30,manager);
      valueToAdopt = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::RefHash2KeysTableOf
                (this,hashModulus,toAdopt,(MemoryManager *)valueToAdopt);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    __buf = extraout_RDX;
    for (uVar2 = 0; uVar2 < itemNumber; uVar2 = uVar2 + 1) {
      valueToAdopt = (XSerializeEngine *)
                     XSerializeEngine::read(serEng,0x434480,__buf,(size_t)valueToAdopt);
      RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::put
                (*objToLoad,((QName *)valueToAdopt->fBufLoadMax)->fLocalPart,
                 ((QName *)valueToAdopt->fBufLoadMax)->fURIId,(SchemaAttDef *)valueToAdopt);
      __buf = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash2KeysTableOf<SchemaAttDef>** objToLoad
                                   , int
                                   , bool                                toAdopt
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash2KeysTableOf<SchemaAttDef>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            SchemaAttDef*  data;
            serEng>>data;

            XMLCh* key1 = data->getAttName()->getLocalPart();
            int    key2 = data->getAttName()->getURI();
            //key2==data->getId()
            (*objToLoad)->put((void*)key1, key2, data);

        }

    }

}